

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdExtension.hpp
# Opt level: O2

ostream * std::operator<<(ostream *os,vector<unsigned_long,_std::allocator<unsigned_long>_> *v)

{
  ostream *poVar1;
  size_t i;
  ulong uVar2;
  
  if ((v->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start !=
      (v->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    poVar1 = std::operator<<(os,"[");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    for (uVar2 = 1;
        uVar2 < (ulong)((long)(v->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(v->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                              ._M_impl.super__Vector_impl_data._M_start >> 3); uVar2 = uVar2 + 1) {
      poVar1 = std::operator<<(os,", ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    }
    std::operator<<(os,"]");
    return os;
  }
  poVar1 = std::operator<<(os,"[]");
  return poVar1;
}

Assistant:

ostream& operator << (ostream& os, const vector<T>& v) {
  if(v.empty()) {
    return os << "[]";
  }
  os<<"["<<v[0];
  for(size_t i = 1; i < v.size(); i++) {
    os<<", "<<v[i];
  }
  os<<"]";
  return os;
}